

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O2

void CMU462::Viewer::showError(string *errorText,bool isFatal)

{
  ostream *poVar1;
  
  showingError = 1;
  errorDismissed = '\0';
  std::__cxx11::string::_M_assign((string *)errorMessage_abi_cxx11_);
  errorFatal = isFatal;
  while (errorDismissed == '\0') {
    update();
  }
  if (!isFatal) {
    showingError = 0;
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"FATAL ERROR: ");
  poVar1 = std::operator<<(poVar1,(string *)errorText);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

void Viewer::showError(std::string errorText, bool isFatal)
{

    // Set the error
    showingError = true;
    errorDismissed = false;
    errorMessage = errorText;
    errorFatal = isFatal;

    // Continue poll/draw loop so we redraw the screen and continue user input
    while(!errorDismissed) {
        Viewer::update();
    }

    // Panic quit if the error was fatal
    if(isFatal) {
        cerr << "FATAL ERROR: " << errorText << endl;
        exit(EXIT_FAILURE);
    }

    showingError = false;
}